

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall sznet::net::Connector::~Connector(Connector *this)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *pLVar3;
  self *this_00;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  Connector *local_10;
  Connector *this_local;
  
  local_10 = this;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_ff0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x1e,DEBUG,"~Connector");
    pLVar3 = Logger::stream(&local_fe0);
    this_00 = LogStream::operator<<(pLVar3,"dtor[");
    pLVar3 = LogStream::operator<<(this_00,this);
    LogStream::operator<<(pLVar3,"]");
    Logger::~Logger(&local_fe0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_channel);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                  ,0x1f,"sznet::net::Connector::~Connector()");
  }
  std::function<void_(int)>::~function(&this->m_newConnectionCallback);
  std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
            (&this->m_channel);
  std::enable_shared_from_this<sznet::net::Connector>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<sznet::net::Connector>);
  return;
}

Assistant:

Connector::~Connector()
{
	LOG_DEBUG << "dtor[" << this << "]";
	assert(!m_channel);
}